

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this,void **vtt)

{
  void **vtt_local;
  IfcConversionBasedUnit *this_local;
  
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcNamedUnit).
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcNamedUnit).
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper
                  [-3]) = vtt[7];
  *(void **)&(this->super_IfcNamedUnit).field_0x38 = vtt[8];
  std::__cxx11::string::~string((string *)&(this->super_IfcNamedUnit).field_0x48);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcConversionBasedUnit,_2UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcConversionBasedUnit,_2UL> *)
             &(this->super_IfcNamedUnit).field_0x38,vtt + 5);
  IfcNamedUnit::~IfcNamedUnit(&this->super_IfcNamedUnit,vtt + 1);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}